

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> * __thiscall
HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::Copy
          (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this)

{
  HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *pHVar1;
  DictionaryStats *pDVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  
  pHVar1 = New(this->alloc,this->tableSize);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < this->tableSize; uVar3 = uVar3 + 1) {
    SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
    CopyTo<&Bucket<ObjWriteGuardBucket>::Copy>
              ((SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               ((long)&(this->table->super_SListNodeBase<Memory::ArenaAllocator>).next + lVar4),
               this->alloc,
               (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               ((long)&(pHVar1->table->super_SListNodeBase<Memory::ArenaAllocator>).next + lVar4));
    lVar4 = lVar4 + 0x10;
  }
  if (this->stats != (DictionaryStats *)0x0) {
    pDVar2 = DictionaryStats::Clone(this->stats);
    pHVar1->stats = pDVar2;
  }
  return pHVar1;
}

Assistant:

HashTable<T> *Copy()
    {
        HashTable<T> *newTable = HashTable<T>::New(this->alloc, this->tableSize);

        for (uint i = 0; i < this->tableSize; i++)
        {
            this->table[i].template CopyTo<Bucket<T>::Copy>(this->alloc, newTable->table[i]);
        }
#if PROFILE_DICTIONARY
        if (stats)
            newTable->stats = stats->Clone();
#endif
        return newTable;
    }